

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

sexp_conflict json_read_object(sexp_conflict ctx,sexp_conflict self,sexp_conflict in)

{
  sexp_gc_var_t *psVar1;
  sexp psVar2;
  bool bVar3;
  ushort **ppuVar4;
  sexp_conflict psVar5;
  double in_RDX;
  sexp in_RDI;
  sexp_conflict unaff_retaddr;
  sexp_conflict in_stack_00000008;
  char *in_stack_00000010;
  sexp_conflict in_stack_00000018;
  sexp_conflict in_stack_00000020;
  int ch;
  int comma;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_58;
  uint local_54;
  uint local_50;
  sexp_conflict *local_48;
  sexp_conflict in_00;
  sexp_conflict psVar6;
  sexp_conflict ctx_00;
  sexp_conflict local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  local_20 = (sexp_conflict)0x43e;
  local_18 = in_RDX;
  local_8 = in_RDI;
  memset(&stack0xffffffffffffffd0,0,0x10);
  psVar6 = (sexp_conflict)&DAT_0000043e;
  memset(&local_48,0,0x10);
  ctx_00 = (sexp_conflict)&local_20;
  psVar1 = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffd0;
  local_48 = (sexp_conflict *)&stack0xffffffffffffffc8;
  in_00 = (sexp_conflict)(((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&local_48;
  bVar3 = true;
  local_20 = (sexp_conflict)0x23e;
  while( true ) {
    do {
      while( true ) {
        if ((((sexp)local_18)->value).type.setters == (sexp)0x0) {
          local_58 = getc((FILE *)(((sexp)local_18)->value).type.getters);
        }
        else {
          if ((((sexp)local_18)->value).type.print < (sexp)(((sexp)local_18)->value).port.size) {
            psVar2 = (((sexp)local_18)->value).type.print;
            (((sexp)local_18)->value).type.print = (sexp)((long)&psVar2->tag + 1);
            local_54 = (uint)*(byte *)((long)&psVar2->tag +
                                      (long)&((((sexp)local_18)->value).type.setters)->tag);
          }
          else {
            local_54 = sexp_buffered_read_char(local_8,local_18);
          }
          local_58 = local_54;
        }
        if (local_58 == 0xffffffff) {
          psVar6 = sexp_json_read_exception
                             (in_stack_00000020,in_stack_00000018,in_stack_00000010,
                              in_stack_00000008,unaff_retaddr);
          goto LAB_0010486a;
        }
        if (local_58 == 0x7d) {
          if ((bVar3) && (local_20 != (sexp_conflict)0x23e)) {
            psVar6 = sexp_json_read_exception
                               (in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                in_stack_00000008,unaff_retaddr);
          }
          else {
            psVar6 = (sexp_conflict)sexp_nreverse_op(local_8,0,1,local_20);
          }
          goto LAB_0010486a;
        }
        if ((local_58 == 0x2c) && (bVar3)) {
          psVar6 = sexp_json_read_exception
                             (in_stack_00000020,in_stack_00000018,in_stack_00000010,
                              in_stack_00000008,unaff_retaddr);
          goto LAB_0010486a;
        }
        if (local_58 != 0x2c) break;
        bVar3 = true;
      }
      ppuVar4 = __ctype_b_loc();
    } while (((*ppuVar4)[(int)local_58] & 0x2000) != 0);
    if (!bVar3) {
      psVar6 = sexp_json_read_exception
                         (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                          unaff_retaddr);
      goto LAB_0010486a;
    }
    if (local_58 != 0xffffffff) {
      if ((((sexp)local_18)->value).type.setters == (sexp)0x0) {
        ungetc(local_58,(FILE *)(((sexp)local_18)->value).type.getters);
      }
      else {
        psVar2 = (((sexp)local_18)->value).type.print;
        (((sexp)local_18)->value).type.print = (sexp)((long)&psVar2[-1].value + 0x60bf);
        *(char *)(((((sexp)local_18)->value).bytecode.max_depth - 1) + (long)psVar2) =
             (char)local_58;
      }
    }
    psVar6 = json_read(ctx_00,psVar6,in_00);
    if ((((ulong)psVar6 & 3) == 0) && (psVar6->tag == 0x13)) goto LAB_0010486a;
    if ((((ulong)psVar6 & 3) == 0) && (psVar6->tag == 9)) {
      psVar6 = (sexp_conflict)sexp_string_to_symbol_op(local_8,0,1,psVar6);
    }
    psVar6 = (sexp_conflict)sexp_cons_op(local_8,0,2,psVar6,0x43e);
    if ((((sexp)local_18)->value).type.setters == (sexp)0x0) {
      local_68 = getc((FILE *)(((sexp)local_18)->value).type.getters);
    }
    else {
      if ((((sexp)local_18)->value).type.print < (sexp)(((sexp)local_18)->value).port.size) {
        psVar2 = (((sexp)local_18)->value).type.print;
        (((sexp)local_18)->value).type.print = (sexp)((long)&psVar2->tag + 1);
        local_64 = (uint)*(byte *)((long)&psVar2->tag +
                                  (long)&((((sexp)local_18)->value).type.setters)->tag);
      }
      else {
        local_64 = sexp_buffered_read_char(local_8,local_18);
      }
      local_68 = local_64;
    }
    local_50 = local_68;
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)local_50] & 0x2000) != 0) {
      if ((((sexp)local_18)->value).type.setters == (sexp)0x0) {
        local_70 = getc((FILE *)(((sexp)local_18)->value).type.getters);
      }
      else {
        if ((((sexp)local_18)->value).type.print < (sexp)(((sexp)local_18)->value).port.size) {
          psVar2 = (((sexp)local_18)->value).type.print;
          (((sexp)local_18)->value).type.print = (sexp)((long)&psVar2->tag + 1);
          local_6c = (uint)*(byte *)((long)&psVar2->tag +
                                    (long)&((((sexp)local_18)->value).type.setters)->tag);
        }
        else {
          local_6c = sexp_buffered_read_char(local_8,local_18);
        }
        local_70 = local_6c;
      }
      local_50 = local_70;
    }
    if (local_50 != 0x3a) {
      psVar6 = sexp_json_read_exception
                         (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                          unaff_retaddr);
      goto LAB_0010486a;
    }
    psVar5 = json_read(ctx_00,psVar6,in_00);
    (psVar6->value).type.cpl = psVar5;
    if ((((psVar6->value).string.offset & 3) == 0) && (((psVar6->value).type.cpl)->tag == 0x13))
    break;
    local_20 = (sexp_conflict)sexp_cons_op(local_8,0,2,psVar6,local_20);
    bVar3 = false;
  }
  psVar6 = (psVar6->value).type.cpl;
LAB_0010486a:
  local_20 = psVar6;
  (((sexp)local_8)->value).context.saves = psVar1;
  return local_20;
}

Assistant:

sexp json_read_object (sexp ctx, sexp self, sexp in) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  int comma = 1, ch;
  res = SEXP_NULL;
  while (1) {
    ch = sexp_read_char(ctx, in);
    if (ch == EOF) {
      res = sexp_json_read_exception(ctx, self, "unterminated object in json", in, SEXP_NULL);
      break;
    } else if (ch == '}') {
      if (comma && res != SEXP_NULL) {
        res = sexp_json_read_exception(ctx, self, "missing value after comma in json object", in, SEXP_NULL);
      } else {
        res = sexp_nreverse(ctx, res);
      }
      break;
    } else if (ch == ',' && comma) {
      res = sexp_json_read_exception(ctx, self, "unexpected comma in json object", in, SEXP_NULL);
      break;
    } else if (ch == ',') {
      comma = 1;
    } else if (!isspace(ch)) {
      if (comma) {
        sexp_push_char(ctx, ch, in);
        tmp = json_read(ctx, self, in);
        if (sexp_exceptionp(tmp)) {
          res = tmp;
          break;
        } else if (sexp_stringp(tmp)) {
          tmp = sexp_string_to_symbol(ctx, tmp);
        }
        tmp = sexp_cons(ctx, tmp, SEXP_VOID);
        for (ch = sexp_read_char(ctx, in); isspace(ch); ch = sexp_read_char(ctx, in))
          ;
        if (ch != ':') {
          res = sexp_json_read_exception(ctx, self, "missing colon in json object", in, sexp_make_character(ch));
          break;
        }
        sexp_cdr(tmp) = json_read(ctx, self, in);
        if (sexp_exceptionp(sexp_cdr(tmp))) {
          res = sexp_cdr(tmp);
          break;
        }
        res = sexp_cons(ctx, tmp, res);
        comma = 0;
      } else {
        res = sexp_json_read_exception(ctx, self, "unexpected value in json object", in, SEXP_NULL);
        break;
      }
    }
  }
  sexp_gc_release2(ctx);
  return res;
}